

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O2

lyplg_ext_record * lyplg_ext_record_find(ly_ctx *ctx,char *module,char *revision,char *name)

{
  lyplg_ext_record *plVar1;
  
  if (ctx != (ly_ctx *)0x0) {
    plVar1 = (lyplg_ext_record *)lyplg_record_find(ctx,LYPLG_EXTENSION,module,revision,name);
    if (plVar1 != (lyplg_ext_record *)0x0) {
      return plVar1;
    }
  }
  plVar1 = (lyplg_ext_record *)lyplg_record_find((ly_ctx *)0x0,LYPLG_EXTENSION,module,revision,name)
  ;
  return plVar1;
}

Assistant:

struct lyplg_ext_record *
lyplg_ext_record_find(const struct ly_ctx *ctx, const char *module, const char *revision, const char *name)
{
    struct lyplg_ext_record *record = NULL;

    if (ctx) {
        /* try to find context specific plugin */
        record = lyplg_record_find(ctx, LYPLG_EXTENSION, module, revision, name);
    }

    if (!record) {
        /* try to find shared plugin */
        record = lyplg_record_find(NULL, LYPLG_EXTENSION, module, revision, name);
    }

    return record;
}